

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O1

JsErrorCode JsVarDeserializerReadValue(JsVarDeserializerHandle deserializerHandle,JsValueRef *value)

{
  JsErrorCode JVar1;
  JsrtContext *currentContext;
  JsValueRef pvVar2;
  ChakraHostDeserializerHandle *deserializer;
  AutoNestedHandledExceptionType local_48 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  JVar1 = JsErrorNullArgument;
  if (value != (JsValueRef *)0x0 && deserializerHandle != (JsVarDeserializerHandle)0x0) {
    currentContext = JsrtContext::GetCurrent();
    JVar1 = CheckContext(currentContext,false,false);
    if (JVar1 == JsNoError) {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      pvVar2 = ChakraHostDeserializerHandle::ReadValue
                         ((ChakraHostDeserializerHandle *)deserializerHandle);
      *value = pvVar2;
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
      JVar1 = JsNoError;
    }
  }
  return JVar1;
}

Assistant:

CHAKRA_API
JsVarDeserializerReadValue(_In_ JsVarDeserializerHandle deserializerHandle, _Out_ JsValueRef* value)
{
    PARAM_NOT_NULL(deserializerHandle);
    PARAM_NOT_NULL(value);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {
        ChakraHostDeserializerHandle* deserializer = reinterpret_cast<ChakraHostDeserializerHandle*>(deserializerHandle);
        *value = deserializer->ReadValue();
        return JsNoError;
    });
}